

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

bool __thiscall VcprojGenerator::otherFiltersContain(VcprojGenerator *this,QString *fileName)

{
  bool bVar1;
  const_iterator __first;
  anon_class_8_1_bc11eba5_for__M_pred __pred;
  long in_RDI;
  long in_FS_OFFSET;
  VCFilter *filter;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_VCFilter_*> *__range1;
  anon_class_8_1_bc11eba5_for__M_pred filterFileMatches;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  const_iterator __last;
  VCFilterFile *local_a0;
  bool local_79;
  initializer_list<const_VCFilter_*> local_70;
  VCFilter *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (VCFilter *)(in_RDI + 0x10c8);
  local_50 = in_RDI + 0x1510;
  local_48 = in_RDI + 0x1958;
  local_40 = in_RDI + 0x1da0;
  local_38 = in_RDI + 0x21e8;
  local_30 = in_RDI + 0x2630;
  local_28 = in_RDI + 0x2a78;
  local_20 = in_RDI + 0x2ec0;
  local_18 = in_RDI + 0x3308;
  local_10 = in_RDI + 0x3750;
  local_70._M_array = &local_58;
  local_70._M_len = 10;
  local_a0 = (VCFilterFile *)std::initializer_list<const_VCFilter_*>::begin(&local_70);
  __first.i = (VCFilterFile *)
              std::initializer_list<const_VCFilter_*>::end
                        ((initializer_list<const_VCFilter_*> *)
                         CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  do {
    if (local_a0 == __first.i) {
      local_79 = false;
LAB_0029a129:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_79;
      }
      __stack_chk_fail();
    }
    __last.i = *local_a0;
    __pred.fileName =
         (QString *)
         QList<VCFilterFile>::cbegin
                   ((QList<VCFilterFile> *)
                    CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    QList<VCFilterFile>::cend
              ((QList<VCFilterFile> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30))
    ;
    bVar1 = std::
            any_of<QList<VCFilterFile>::const_iterator,VcprojGenerator::otherFiltersContain(QString_const&)const::__0>
                      (__first,__last,__pred);
    if (bVar1) {
      local_79 = true;
      goto LAB_0029a129;
    }
    local_a0 = (VCFilterFile *)&local_a0->file;
  } while( true );
}

Assistant:

bool VcprojGenerator::otherFiltersContain(const QString &fileName) const
{
    auto filterFileMatches = [&fileName] (const VCFilterFile &ff)
    {
        return ff.file == fileName;
    };
    for (const VCFilter *filter : { &vcProject.RootFiles,
                                    &vcProject.SourceFiles,
                                    &vcProject.HeaderFiles,
                                    &vcProject.GeneratedFiles,
                                    &vcProject.LexYaccFiles,
                                    &vcProject.TranslationFiles,
                                    &vcProject.FormFiles,
                                    &vcProject.ResourceFiles,
                                    &vcProject.DeploymentFiles,
                                    &vcProject.DistributionFiles}) {
        if (std::any_of(filter->Files.cbegin(), filter->Files.cend(), filterFileMatches))
            return true;
    }
    return false;
}